

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.upb.h
# Opt level: O0

int32_t google_protobuf_DescriptorProto_ReservedRange_start
                  (google_protobuf_DescriptorProto_ReservedRange *msg)

{
  _Bool _Var1;
  int32_t iVar2;
  void *from;
  undefined1 local_44 [8];
  upb_MiniTableField field;
  int32_t ret;
  int32_t default_val;
  google_protobuf_DescriptorProto_ReservedRange *msg_local;
  int32_t iVar3;
  
  field.submsg_index_dont_copy_me__upb_internal_use_only = 0;
  field.descriptortype_dont_copy_me__upb_internal_use_only = '\0';
  field.mode_dont_copy_me__upb_internal_use_only = '\0';
  local_44._0_4_ = 1;
  local_44._4_2_ = 0xc;
  local_44._6_2_ = 0x40;
  field.number_dont_copy_me__upb_internal_use_only = 0x4205ffff;
  _Var1 = upb_MiniTableField_IsExtension((upb_MiniTableField *)local_44);
  if (_Var1) {
    __assert_fail("!upb_MiniTableField_IsExtension(field)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x10d,
                  "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                 );
  }
  _Var1 = upb_MiniTableField_IsInOneof((upb_MiniTableField *)local_44);
  if (((_Var1) ||
      (_Var1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only
                         ((upb_MiniTableField *)local_44,
                          &field.submsg_index_dont_copy_me__upb_internal_use_only), !_Var1)) &&
     (_Var1 = upb_Message_HasBaseField
                        (&msg->base_dont_copy_me__upb_internal_use_only,
                         (upb_MiniTableField *)local_44), !_Var1)) {
    _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
              ((upb_MiniTableField *)local_44,&field.offset_dont_copy_me__upb_internal_use_only,
               &field.submsg_index_dont_copy_me__upb_internal_use_only);
    iVar3._0_2_ = field.offset_dont_copy_me__upb_internal_use_only;
    iVar3._2_2_ = field.presence;
    return iVar3;
  }
  from = _upb_Message_DataPtr_dont_copy_me__upb_internal_use_only
                   (&msg->base_dont_copy_me__upb_internal_use_only,(upb_MiniTableField *)local_44);
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
            ((upb_MiniTableField *)local_44,&field.offset_dont_copy_me__upb_internal_use_only,from);
  iVar2._0_2_ = field.offset_dont_copy_me__upb_internal_use_only;
  iVar2._2_2_ = field.presence;
  return iVar2;
}

Assistant:

UPB_INLINE int32_t google_protobuf_DescriptorProto_ReservedRange_start(const google_protobuf_DescriptorProto_ReservedRange* msg) {
  int32_t default_val = (int32_t)0;
  int32_t ret;
  const upb_MiniTableField field = {1, 12, 64, kUpb_NoSub, 5, (int)kUpb_FieldMode_Scalar | ((int)kUpb_FieldRep_4Byte << kUpb_FieldRep_Shift)};
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}